

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  
  pbVar1 = (byte *)s;
LAB_00694118:
  do {
    pbVar2 = pbVar1;
    bVar3 = *pbVar2;
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) goto LAB_00694155;
    bVar3 = pbVar2[1];
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
      pbVar2 = pbVar2 + 1;
      goto LAB_00694155;
    }
    bVar3 = pbVar2[2];
    if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
      pbVar2 = pbVar2 + 2;
      goto LAB_00694155;
    }
    bVar3 = pbVar2[3];
    pbVar1 = pbVar2 + 4;
  } while (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0);
  pbVar2 = pbVar2 + 3;
LAB_00694155:
  pbVar1 = pbVar2;
  if (bVar3 == 0x3c) goto LAB_0069418b;
  if (bVar3 != 0) {
    pbVar1 = pbVar2 + 1;
    goto LAB_00694118;
  }
  do {
    pbVar4 = pbVar1;
    if (pbVar4 <= s) break;
    pbVar1 = pbVar4 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar4[-1]] & 8) != 0);
  *pbVar4 = 0;
  return (char_t *)pbVar2;
  while (pbVar1 = pbVar4 + -1, ((anonymous_namespace)::chartype_table[pbVar4[-1]] & 8) != 0) {
LAB_0069418b:
    pbVar4 = pbVar1;
    if (pbVar4 <= s) break;
  }
  *pbVar4 = 0;
  return (char_t *)(pbVar2 + 1);
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}